

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyBQ2Div(TidyDocImpl *doc,Node *node)

{
  Stack *stack;
  Node *pNVar1;
  Node *node_00;
  int iVar2;
  uint uVar3;
  tmbchar indent_buf [32];
  tmbchar atStack_58 [40];
  
  stack = prvTidynewStack(doc,0x10);
  if (node != (Node *)0x0) {
    do {
      node_00 = node->next;
      if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_BLOCKQUOTE)) &&
         (node->implicit != no)) {
        pNVar1 = node->content;
        if (pNVar1 == (Node *)0x0) {
          uVar3 = 2;
        }
        else {
          iVar2 = 1;
          do {
            if (((pNVar1->next != (Node *)0x0) || (pNVar1->tag == (Dict *)0x0)) ||
               ((pNVar1->tag->id != TidyTag_BLOCKQUOTE || (node->implicit == no)))) break;
            iVar2 = iVar2 + 1;
            StripOnlyChild(doc,node);
            pNVar1 = node->content;
          } while (pNVar1 != (Node *)0x0);
          uVar3 = iVar2 * 2;
        }
        prvTidytmbsnprintf(atStack_58,0x20,"margin-left: %dem",(ulong)uVar3);
        RenameElem(doc,node,TidyTag_DIV);
        prvTidyAddStyleProperty(doc,node,atStack_58);
      }
      if (node->content == (Node *)0x0) {
        if (node_00 == (Node *)0x0) {
          node_00 = prvTidypop(stack);
        }
      }
      else {
        prvTidypush(stack,node_00);
        node_00 = node->content;
      }
      node = node_00;
    } while (node_00 != (Node *)0x0);
  }
  prvTidyfreeStack(stack);
  return;
}

Assistant:

void TY_(BQ2Div)( TidyDocImpl* doc, Node *node )
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node *next;
    
    tmbchar indent_buf[ 32 ];
    uint indent;

    while (node)
    {
        next = node->next;
        
        if ( nodeIsBLOCKQUOTE(node) && node->implicit )
        {
            indent = 1;

            while( HasOneChild(node) &&
                   nodeIsBLOCKQUOTE(node->content) &&
                   node->implicit)
            {
                ++indent;
                StripOnlyChild( doc, node );
            }

            TY_(tmbsnprintf)(indent_buf, sizeof(indent_buf), "margin-left: %dem",
                             2*indent);

            RenameElem( doc, node, TidyTag_DIV );
            TY_(AddStyleProperty)(doc, node, indent_buf );

            if (node->content)
            {
                TY_(push)(stack, next);
                node = node->content;
                continue;
            }
        }
        else if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}